

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O0

void __thiscall TimeStampReq::Encode(TimeStampReq *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  size_t sVar1;
  uchar *puVar2;
  size_t *psVar3;
  undefined1 local_48 [8];
  EncodeHelper eh;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *pOut_local;
  TimeStampReq *this_local;
  
  eh.cbUsed = cbUsed;
  EncodeHelper::EncodeHelper((EncodeHelper *)local_48,cbUsed);
  sVar1 = DerBase::EncodedSize(&this->super_DerBase);
  EncodeHelper::Init((EncodeHelper *)local_48,sVar1,pOut,cbOut,'0',(this->super_DerBase).cbData);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar3 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  Integer::Encode(&this->version,puVar2,sVar1,psVar3);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar3 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  MessageImprint::Encode(&this->messageImprint,puVar2,sVar1,psVar3);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar3 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  ObjectIdentifier::Encode(&this->reqPolicy,puVar2,sVar1,psVar3);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar3 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  Integer::Encode(&this->nonce,puVar2,sVar1,psVar3);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar3 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  Boolean::Encode(&this->certReq,puVar2,sVar1,psVar3);
  EncodeHelper::Update((EncodeHelper *)local_48);
  puVar2 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
  psVar3 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
  Extensions::Encode(&this->extensions,puVar2,sVar1,psVar3);
  EncodeHelper::Finalize((EncodeHelper *)local_48);
  EncodeHelper::~EncodeHelper((EncodeHelper *)local_48);
  return;
}

Assistant:

void TimeStampReq::Encode(unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
    EncodeHelper eh(cbUsed);

    eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);

    version.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Update();

    messageImprint.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Update();

    reqPolicy.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Update();

    nonce.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Update();

    certReq.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Update();

    extensions.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Finalize();
}